

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concat.cpp
# Opt level: O1

int __thiscall
ncnn::Concat::forward
          (Concat *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint _c;
  size_t _elemsize;
  Mat *pMVar4;
  int *piVar5;
  pointer pMVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  size_t sVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  void *pvVar19;
  bool bVar20;
  
  pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar1 = pMVar6->dims;
  _elemsize = pMVar6->elemsize;
  iVar17 = this->axis;
  if (uVar1 == 1) {
    lVar8 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pMVar6;
    if (lVar8 == 0) {
      iVar12 = 0;
    }
    else {
      lVar8 = (lVar8 >> 3) * -0x71c71c71c71c71c7;
      lVar8 = lVar8 + (ulong)(lVar8 == 0);
      piVar5 = &pMVar6->w;
      iVar12 = 0;
      do {
        iVar12 = iVar12 + *piVar5;
        piVar5 = piVar5 + 0x12;
        lVar8 = lVar8 + -1;
      } while (lVar8 != 0);
    }
    pMVar4 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar4,iVar12,_elemsize,opt->blob_allocator);
    pvVar19 = pMVar4->data;
    if (pvVar19 == (void *)0x0) {
      bVar20 = true;
    }
    else {
      bVar20 = (long)pMVar4->c * pMVar4->cstep == 0;
    }
    if (bVar20) {
      return -100;
    }
    pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_finish != pMVar6) {
      lVar8 = 0;
      uVar11 = 0;
      do {
        sVar14 = (long)*(int *)((long)&pMVar6->w + lVar8) * _elemsize;
        memcpy(pvVar19,*(void **)((long)&pMVar6->data + lVar8),sVar14);
        pvVar19 = (void *)((long)pvVar19 + sVar14);
        uVar11 = uVar11 + 1;
        pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar8 = lVar8 + 0x48;
      } while (uVar11 < (ulong)(((long)(bottom_blobs->
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar6 >> 3
                                ) * -0x71c71c71c71c71c7));
    }
    if (bVar20) {
      return -100;
    }
  }
  iVar17 = (iVar17 >> 0x1f & uVar1) + iVar17;
  if ((uVar1 == 2) && (iVar17 == 0)) {
    pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar12 = pMVar6->w;
    lVar8 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pMVar6;
    if (lVar8 == 0) {
      iVar7 = 0;
    }
    else {
      lVar8 = (lVar8 >> 3) * -0x71c71c71c71c71c7;
      lVar8 = lVar8 + (ulong)(lVar8 == 0);
      piVar5 = &pMVar6->h;
      iVar7 = 0;
      do {
        iVar7 = iVar7 + *piVar5;
        piVar5 = piVar5 + 0x12;
        lVar8 = lVar8 + -1;
      } while (lVar8 != 0);
    }
    pMVar4 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar4,iVar12,iVar7,_elemsize,opt->blob_allocator);
    pvVar19 = pMVar4->data;
    if (pvVar19 == (void *)0x0) {
      bVar20 = true;
    }
    else {
      bVar20 = (long)pMVar4->c * pMVar4->cstep == 0;
    }
    if (bVar20) {
      return -100;
    }
    pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_finish != pMVar6) {
      lVar8 = 0;
      uVar11 = 0;
      do {
        sVar14 = (long)*(int *)((long)&pMVar6->h + lVar8) * (long)iVar12 * _elemsize;
        memcpy(pvVar19,*(void **)((long)&pMVar6->data + lVar8),sVar14);
        pvVar19 = (void *)((long)pvVar19 + sVar14);
        uVar11 = uVar11 + 1;
        pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar8 = lVar8 + 0x48;
      } while (uVar11 < (ulong)(((long)(bottom_blobs->
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar6 >> 3
                                ) * -0x71c71c71c71c71c7));
    }
  }
  if ((uVar1 == 2) && (iVar17 == 1)) {
    pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar2 = pMVar6->h;
    lVar8 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pMVar6;
    if (lVar8 == 0) {
      iVar12 = 0;
    }
    else {
      lVar8 = (lVar8 >> 3) * -0x71c71c71c71c71c7;
      lVar8 = lVar8 + (ulong)(lVar8 == 0);
      piVar5 = &pMVar6->w;
      iVar12 = 0;
      do {
        iVar12 = iVar12 + *piVar5;
        piVar5 = piVar5 + 0x12;
        lVar8 = lVar8 + -1;
      } while (lVar8 != 0);
    }
    pMVar4 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar4,iVar12,uVar2,_elemsize,opt->blob_allocator);
    if (pMVar4->data == (void *)0x0) {
      bVar20 = true;
    }
    else {
      bVar20 = (long)pMVar4->c * pMVar4->cstep == 0;
    }
    if (bVar20) {
      return -100;
    }
    if (0 < (int)uVar2) {
      uVar11 = 0;
      do {
        pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_finish != pMVar6) {
          pvVar19 = (void *)((long)pMVar4->w * uVar11 * pMVar4->elemsize + (long)pMVar4->data);
          lVar8 = 0x2c;
          uVar15 = 0;
          do {
            lVar9 = (long)*(int *)((long)&pMVar6->data + lVar8);
            memcpy(pvVar19,(void *)(uVar11 * lVar9 * *(long *)((long)pMVar6 + lVar8 + -0x1c) +
                                   *(long *)((long)pMVar6 + lVar8 + -0x2c)),lVar9 * _elemsize);
            pvVar19 = (void *)((long)pvVar19 +
                              (long)*(int *)((long)&pMVar6->data + lVar8) * _elemsize);
            uVar15 = uVar15 + 1;
            pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            lVar8 = lVar8 + 0x48;
          } while (uVar15 < (ulong)(((long)(bottom_blobs->
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pMVar6 >> 3) * -0x71c71c71c71c71c7));
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != uVar2);
    }
    if (bVar20) {
      return -100;
    }
  }
  if ((uVar1 - 3 < 2) && (iVar17 == 0)) {
    pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar8 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pMVar6;
    if (lVar8 == 0) {
      iVar12 = 0;
    }
    else {
      lVar8 = (lVar8 >> 3) * -0x71c71c71c71c71c7;
      lVar8 = lVar8 + (ulong)(lVar8 == 0);
      piVar5 = &pMVar6->c;
      iVar12 = 0;
      do {
        iVar12 = iVar12 + *piVar5;
        piVar5 = piVar5 + 0x12;
        lVar8 = lVar8 + -1;
      } while (lVar8 != 0);
    }
    pMVar4 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar4,pMVar6->w,pMVar6->h,pMVar6->d,iVar12,_elemsize,opt->blob_allocator);
    if (pMVar4->data == (void *)0x0) {
      bVar20 = true;
    }
    else {
      bVar20 = (long)pMVar4->c * pMVar4->cstep == 0;
    }
    if (bVar20) {
      return -100;
    }
    pMVar4->dims = uVar1;
    pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_finish != pMVar6) {
      iVar12 = 0;
      lVar8 = 0x40;
      uVar11 = 0;
      do {
        iVar7 = *(int *)((long)pMVar6 + lVar8 + -8);
        memcpy((void *)(pMVar4->cstep * (long)iVar12 * pMVar4->elemsize + (long)pMVar4->data),
               *(void **)((long)pMVar6 + lVar8 + -0x40),
               (long)iVar7 * _elemsize * *(long *)((long)&pMVar6->data + lVar8));
        iVar12 = iVar12 + iVar7;
        uVar11 = uVar11 + 1;
        pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar8 = lVar8 + 0x48;
      } while (uVar11 < (ulong)(((long)(bottom_blobs->
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar6 >> 3
                                ) * -0x71c71c71c71c71c7));
    }
    if (bVar20) {
      return -100;
    }
  }
  if ((iVar17 == 1 && uVar1 == 3) || (uVar1 == 4 && iVar17 == 2)) {
    pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar2 = pMVar6->d;
    uVar3 = pMVar6->c;
    lVar8 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pMVar6;
    if (lVar8 == 0) {
      iVar12 = 0;
    }
    else {
      lVar8 = (lVar8 >> 3) * -0x71c71c71c71c71c7;
      lVar8 = lVar8 + (ulong)(lVar8 == 0);
      piVar5 = &pMVar6->h;
      iVar12 = 0;
      do {
        iVar12 = iVar12 + *piVar5;
        piVar5 = piVar5 + 0x12;
        lVar8 = lVar8 + -1;
      } while (lVar8 != 0);
    }
    pMVar4 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar4,pMVar6->w,iVar12,uVar2,uVar3,_elemsize,opt->blob_allocator);
    if (pMVar4->data == (void *)0x0) {
      bVar20 = true;
    }
    else {
      bVar20 = (long)pMVar4->c * pMVar4->cstep == 0;
    }
    if (bVar20) {
      return -100;
    }
    pMVar4->dims = uVar1;
    if (0 < (int)uVar3) {
      uVar11 = 0;
      do {
        if (0 < (int)uVar2) {
          pvVar19 = (void *)(pMVar4->cstep * uVar11 * pMVar4->elemsize + (long)pMVar4->data);
          uVar15 = 0;
          do {
            pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_finish != pMVar6) {
              lVar8 = 0x40;
              uVar18 = 0;
              do {
                lVar10 = (long)*(int *)((long)pMVar6 + lVar8 + -0x14);
                lVar9 = *(long *)((long)pMVar6 + lVar8 + -0x30);
                lVar13 = (long)*(int *)((long)pMVar6 + lVar8 + -0x10);
                sVar14 = lVar13 * lVar10 * _elemsize;
                memcpy(pvVar19,(void *)(lVar9 * lVar13 * uVar15 * lVar10 +
                                       *(long *)((long)&pMVar6->data + lVar8) * uVar11 * lVar9 +
                                       *(long *)((long)pMVar6 + lVar8 + -0x40)),sVar14);
                pvVar19 = (void *)(sVar14 + (long)pvVar19);
                uVar18 = uVar18 + 1;
                pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                         _M_impl.super__Vector_impl_data._M_start;
                lVar8 = lVar8 + 0x48;
              } while (uVar18 < (ulong)(((long)(bottom_blobs->
                                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                               )._M_impl.super__Vector_impl_data._M_finish -
                                         (long)pMVar6 >> 3) * -0x71c71c71c71c71c7));
            }
            uVar15 = uVar15 + 1;
          } while (uVar15 != uVar2);
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != uVar3);
    }
    if (bVar20) {
      return -100;
    }
  }
  if ((uVar1 == 3 && iVar17 == 2) || (uVar1 == 4 && iVar17 == 3)) {
    pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar2 = pMVar6->h;
    uVar3 = pMVar6->d;
    _c = pMVar6->c;
    lVar8 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pMVar6;
    if (lVar8 == 0) {
      iVar12 = 0;
    }
    else {
      lVar8 = (lVar8 >> 3) * -0x71c71c71c71c71c7;
      lVar8 = lVar8 + (ulong)(lVar8 == 0);
      piVar5 = &pMVar6->w;
      iVar12 = 0;
      do {
        iVar12 = iVar12 + *piVar5;
        piVar5 = piVar5 + 0x12;
        lVar8 = lVar8 + -1;
      } while (lVar8 != 0);
    }
    pMVar4 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar4,iVar12,uVar2,uVar3,_c,_elemsize,opt->blob_allocator);
    if (pMVar4->data == (void *)0x0) {
      bVar20 = true;
    }
    else {
      bVar20 = (long)pMVar4->c * pMVar4->cstep == 0;
    }
    if (bVar20) {
      return -100;
    }
    pMVar4->dims = uVar1;
    if (0 < (int)_c) {
      uVar11 = 0;
      do {
        if (0 < (int)uVar3) {
          pvVar19 = (void *)(pMVar4->cstep * uVar11 * pMVar4->elemsize + (long)pMVar4->data);
          uVar15 = 0;
          do {
            if (0 < (int)uVar2) {
              uVar18 = 0;
              do {
                pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                         _M_impl.super__Vector_impl_data._M_start;
                if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_finish != pMVar6) {
                  lVar8 = 0x40;
                  uVar16 = 0;
                  do {
                    lVar10 = (long)*(int *)((long)pMVar6 + lVar8 + -0x14);
                    lVar9 = *(long *)((long)pMVar6 + lVar8 + -0x30);
                    lVar13 = lVar9 * lVar10;
                    memcpy(pvVar19,(void *)(lVar13 * uVar18 +
                                            (long)*(int *)((long)pMVar6 + lVar8 + -0x10) * uVar15 *
                                            lVar13 + *(long *)((long)&pMVar6->data + lVar8) * uVar11
                                                     * lVar9 + *(long *)((long)pMVar6 +
                                                                        lVar8 + -0x40)),
                           lVar10 * _elemsize);
                    pvVar19 = (void *)((long)*(int *)((long)pMVar6 + lVar8 + -0x14) * _elemsize +
                                      (long)pvVar19);
                    uVar16 = uVar16 + 1;
                    pMVar6 = (bottom_blobs->
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                             super__Vector_impl_data._M_start;
                    lVar8 = lVar8 + 0x48;
                  } while (uVar16 < (ulong)(((long)(bottom_blobs->
                                                                                                      
                                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                             (long)pMVar6 >> 3) * -0x71c71c71c71c71c7));
                }
                uVar18 = uVar18 + 1;
              } while (uVar18 != uVar2);
            }
            uVar15 = uVar15 + 1;
          } while (uVar15 != uVar3);
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != _c);
    }
  }
  if ((uVar1 == 4) && (iVar17 == 1)) {
    pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar1 = pMVar6->c;
    lVar8 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pMVar6;
    if (lVar8 == 0) {
      iVar17 = 0;
    }
    else {
      lVar8 = (lVar8 >> 3) * -0x71c71c71c71c71c7;
      lVar8 = lVar8 + (ulong)(lVar8 == 0);
      piVar5 = &pMVar6->d;
      iVar17 = 0;
      do {
        iVar17 = iVar17 + *piVar5;
        piVar5 = piVar5 + 0x12;
        lVar8 = lVar8 + -1;
      } while (lVar8 != 0);
    }
    pMVar4 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar4,pMVar6->w,pMVar6->h,iVar17,uVar1,_elemsize,opt->blob_allocator);
    if (pMVar4->data == (void *)0x0) {
      bVar20 = true;
    }
    else {
      bVar20 = (long)pMVar4->c * pMVar4->cstep == 0;
    }
    if (bVar20) {
      return -100;
    }
    if (0 < (int)uVar1) {
      uVar11 = 0;
      do {
        pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_finish != pMVar6) {
          pvVar19 = (void *)(pMVar4->cstep * uVar11 * pMVar4->elemsize + (long)pMVar4->data);
          lVar8 = 0x40;
          uVar15 = 0;
          do {
            sVar14 = (long)*(int *)((long)pMVar6 + lVar8 + -0xc) * _elemsize *
                     (long)*(int *)((long)pMVar6 + lVar8 + -0x10) *
                     (long)*(int *)((long)pMVar6 + lVar8 + -0x14);
            memcpy(pvVar19,(void *)(*(long *)((long)&pMVar6->data + lVar8) * uVar11 *
                                    *(long *)((long)pMVar6 + lVar8 + -0x30) +
                                   *(long *)((long)pMVar6 + lVar8 + -0x40)),sVar14);
            pvVar19 = (void *)((long)pvVar19 + sVar14);
            uVar15 = uVar15 + 1;
            pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            lVar8 = lVar8 + 0x48;
          } while (uVar15 < (ulong)(((long)(bottom_blobs->
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pMVar6 >> 3) * -0x71c71c71c71c71c7));
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != uVar1);
    }
    if (bVar20) {
      return -100;
    }
  }
  return 0;
}

Assistant:

int Concat::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    int dims = bottom_blobs[0].dims;
    size_t elemsize = bottom_blobs[0].elemsize;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        // concat vector
        // total length
        int top_w = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        unsigned char* outptr = top_blob;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            int w = bottom_blob.w;

            const unsigned char* ptr = bottom_blob;
            memcpy(outptr, ptr, w * elemsize);

            outptr += w * elemsize;
        }
    }

    if (dims == 2 && positive_axis == 0)
    {
        // concat image
        int w = bottom_blobs[0].w;

        // total height
        int top_h = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_h += bottom_blob.h;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, top_h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        unsigned char* outptr = top_blob;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            int size = w * bottom_blob.h;

            const unsigned char* ptr = bottom_blob;
            memcpy(outptr, ptr, size * elemsize);

            outptr += size * elemsize;
        }
    }

    if (dims == 2 && positive_axis == 1)
    {
        // interleave image row
        int h = bottom_blobs[0].h;

        // total width
        int top_w = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            unsigned char* outptr = top_blob.row<unsigned char>(i);
            for (size_t b = 0; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob = bottom_blobs[b];

                const unsigned char* ptr = bottom_blob.row<const unsigned char>(i);
                memcpy(outptr, ptr, bottom_blob.w * elemsize);

                outptr += bottom_blob.w * elemsize;
            }
        }
    }

    if ((dims == 3 || dims == 4) && positive_axis == 0)
    {
        // concat dim
        int w = bottom_blobs[0].w;
        int h = bottom_blobs[0].h;
        int d = bottom_blobs[0].d;

        // total channels
        int top_channels = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_channels += bottom_blob.c;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, h, d, top_channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        top_blob.dims = dims;

        int q = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            int channels = bottom_blob.c;
            size_t size = bottom_blob.cstep * channels;

            const unsigned char* ptr = bottom_blob;
            unsigned char* outptr = top_blob.channel(q);
            memcpy(outptr, ptr, size * elemsize);

            q += channels;
        }
    }

    if ((dims == 3 && positive_axis == 1) || (dims == 4 && positive_axis == 2))
    {
        // interleave dim height
        int w = bottom_blobs[0].w;
        int d = bottom_blobs[0].d;
        int channels = bottom_blobs[0].c;

        // total height
        int top_h = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_h += bottom_blob.h;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, top_h, d, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        top_blob.dims = dims;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            unsigned char* outptr = top_blob.channel(q);

            for (int i = 0; i < d; i++)
            {
                for (size_t b = 0; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob = bottom_blobs[b];

                    int size = bottom_blob.w * bottom_blob.h;

                    const unsigned char* ptr = bottom_blob.channel(q).depth(i);
                    memcpy(outptr, ptr, size * elemsize);

                    outptr += size * elemsize;
                }
            }
        }
    }

    if ((dims == 3 && positive_axis == 2) || (dims == 4 && positive_axis == 3))
    {
        // interleave dim width
        int h = bottom_blobs[0].h;
        int d = bottom_blobs[0].d;
        int channels = bottom_blobs[0].c;

        // total width
        int top_w = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, h, d, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        top_blob.dims = dims;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            unsigned char* outptr = top_blob.channel(q);

            for (int i = 0; i < d; i++)
            {
                for (int j = 0; j < h; j++)
                {
                    for (size_t b = 0; b < bottom_blobs.size(); b++)
                    {
                        const Mat& bottom_blob = bottom_blobs[b];

                        const unsigned char* ptr = bottom_blob.channel(q).depth(i).row<const unsigned char>(j);
                        memcpy(outptr, ptr, bottom_blob.w * elemsize);

                        outptr += bottom_blob.w * elemsize;
                    }
                }
            }
        }
    }

    if (dims == 4 && positive_axis == 1)
    {
        // interleave dim depth
        int w = bottom_blobs[0].w;
        int h = bottom_blobs[0].h;
        int channels = bottom_blobs[0].c;

        // total depth
        int top_d = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_d += bottom_blob.d;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, h, top_d, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            unsigned char* outptr = top_blob.channel(q);

            for (size_t b = 0; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob = bottom_blobs[b];

                int size = bottom_blob.w * bottom_blob.h * bottom_blob.d;

                const unsigned char* ptr = bottom_blob.channel(q);
                memcpy(outptr, ptr, size * elemsize);

                outptr += size * elemsize;
            }
        }
    }

    return 0;
}